

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadLiteralSelector.hpp
# Opt level: O0

void __thiscall
Kernel::LookaheadLiteralSelector::LookaheadLiteralSelector
          (LookaheadLiteralSelector *this,bool completeSelection,Ordering *ordering,Options *options
          )

{
  int iVar1;
  Options *in_RCX;
  Ordering *in_RDX;
  byte in_SIL;
  LiteralSelector *in_RDI;
  int in_stack_00000054;
  Options *in_stack_00000058;
  Ordering *in_stack_00000060;
  LiteralSelector *local_40;
  
  LiteralSelector::LiteralSelector(in_RDI,in_RDX,in_RCX);
  in_RDI->_vptr_LiteralSelector = (_func_int **)&PTR__LookaheadLiteralSelector_0131f6d8;
  in_RDI->field_0x19 = in_SIL & 1;
  iVar1 = Shell::Options::lookaheadDelay(in_RCX);
  *(int *)&in_RDI[1]._ord = iVar1;
  *(undefined4 *)((long)&in_RDI[1]._ord + 4) = 0;
  if (*(int *)&in_RDI[1]._ord == 0) {
    local_40 = (LiteralSelector *)0x0;
  }
  else {
    local_40 = LiteralSelector::getSelector(in_stack_00000060,in_stack_00000058,in_stack_00000054);
  }
  in_RDI[1]._vptr_LiteralSelector = (_func_int **)local_40;
  return;
}

Assistant:

LookaheadLiteralSelector(bool completeSelection, const Ordering& ordering, const Options& options)
  : LiteralSelector(ordering, options), _completeSelection(completeSelection)
  {
    _delay = options.lookaheadDelay();
    _skipped = 0;
    _startupSelector = (_delay==0) ? 0 : LiteralSelector::getSelector(ordering, options, completeSelection ? 10 : 1010);
  }